

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplevm.cpp
# Opt level: O1

int32_t * Compile(string *src_code,size_t *rsz)

{
  byte ch;
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  byte ch_00;
  int32_t *program;
  invalid_argument *this;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  size_t sz;
  size_t local_40;
  size_t *local_38;
  
  uVar4 = src_code->_M_string_length;
  iVar6 = 0;
  local_38 = rsz;
  program = (int32_t *)operator_new__(-(ulong)((uVar4 & 0x6000000000000000) != 0) | uVar4 * 8);
  local_40 = 0;
  if (uVar4 != 0) {
    pcVar1 = (src_code->_M_dataplus)._M_p;
    ch_00 = 0x41;
    uVar5 = 0;
    do {
      ch = pcVar1[uVar5];
      if (ch < 0x3c) {
        switch(ch) {
        case 0x2b:
        case 0x2d:
switchD_001013c4_caseD_2b:
          if (ch_00 == ch) {
            iVar6 = iVar6 + 1;
          }
          else {
            ConvertToBytecode(ch_00,iVar6,program,&local_40);
            iVar6 = 1;
            ch_00 = ch;
          }
          break;
        case 0x2c:
        case 0x2e:
switchD_001013c4_caseD_2c:
          ConvertToBytecode(ch_00,iVar6,program,&local_40);
          iVar6 = 0;
          ConvertToBytecode(ch,0,program,&local_40);
          ch_00 = 0x41;
        }
      }
      else if (ch < 0x5b) {
        if ((ch == 0x3c) || (ch == 0x3e)) goto switchD_001013c4_caseD_2b;
      }
      else if ((ch == 0x5b) || (ch == 0x5d)) goto switchD_001013c4_caseD_2c;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  if (1 < local_40) {
    uVar4 = 0;
    iVar6 = 2;
    iVar7 = 3;
    do {
      iVar2 = (int)uVar4;
      if (program[(uint)(iVar2 * 2)] == 7) {
        iVar9 = 1;
        iVar8 = iVar7;
        iVar10 = iVar6;
        do {
          if (local_40 >> 1 <= (ulong)(long)(iVar10 + -1)) break;
          bVar3 = true;
          if (program[iVar8 + -1] == 8) {
            iVar9 = iVar9 + -1;
            if (iVar9 == 0) {
              program[iVar2 * 2 | 1] = iVar10;
              program[iVar8] = iVar2;
              bVar3 = false;
              iVar9 = 0;
            }
          }
          else if (program[iVar8 + -1] == 7) {
            iVar9 = iVar9 + 1;
          }
          iVar10 = iVar10 + 1;
          iVar8 = iVar8 + 2;
        } while (bVar3);
        if (iVar9 != 0) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this,"Un-matched [");
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
      }
      uVar4 = (ulong)(iVar2 + 1);
      iVar6 = iVar6 + 1;
      iVar7 = iVar7 + 2;
    } while (uVar4 < local_40 >> 1);
  }
  *local_38 = local_40;
  return program;
}

Assistant:

int32_t* Compile(const std::string& src_code, size_t *rsz) {
    size_t max_sz = src_code.length() * 2;
    int32_t *program = new int32_t[max_sz];
    size_t sz = 0;

    // compile the source code into vm bytecode
    const char* data = src_code.data();
    const size_t len = src_code.length();
    char prevCh = 'A';
    int32_t count = 0;
    for (int i = 0; i < len; i++) {
        char ch = data[i];
        switch (ch)
        {
            case '+':;
            case '-':;
            case '>':;
            case '<':;
                if (prevCh == ch) {
                    count++;
                } else {
                    ConvertToBytecode(prevCh, count, program, &sz);
                    prevCh = ch;
                    count = 1;
                }
                break;

            case '.':;
            case ',':;
            case '[':;
            case ']':
                ConvertToBytecode(prevCh, count, program, &sz);
                ConvertToBytecode(ch, 0, program, &sz);
                prevCh = 'A';
                count = 0;
                break;
        }
    }

    // pass two - set jz/jmp destination address
    for (uint32_t addr = 0; addr < sz / 2; addr++) {
        int32_t op = program[addr * 2];
        if (op != JZ) {
            continue;
        }

        int nesting = 1;
        for (int32_t tmpaddr = addr + 1; tmpaddr < sz / 2; tmpaddr++) {
            int32_t tmpop = program[tmpaddr * 2];
            if (tmpop == JZ) {
                nesting++;
            }
            else if (tmpop == JMP) {
                nesting--;
                if (nesting == 0) {
                    program[addr * 2 + 1] = tmpaddr + 1;
                    program[tmpaddr * 2 + 1] = addr;
                    break;
                }
            }
        }
        if (nesting != 0) {
            throw std::invalid_argument("Un-matched [");
        }
    }

    *rsz = sz;
    return program;
}